

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void read_debug_prefix_nal_unit_svc(nal_t *nal,bs_t *b)

{
  uint32_t uVar1;
  int iVar2;
  FILE *local_58;
  FILE *local_50;
  FILE *local_48;
  FILE *local_40;
  FILE *local_38;
  FILE *local_30;
  FILE *local_28;
  FILE *local_20;
  bs_t *b_local;
  nal_t *nal_local;
  
  if (nal->nal_ref_idc == 0) {
    iVar2 = more_rbsp_data(b);
    if (iVar2 != 0) {
      while (iVar2 = more_rbsp_data(b), iVar2 != 0) {
        if (h264_dbgfile == (FILE *)0x0) {
          local_50 = _stdout;
        }
        else {
          local_50 = (FILE *)h264_dbgfile;
        }
        fprintf(local_50,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        uVar1 = bs_read_u1(b);
        nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag = uVar1 != 0;
        if (h264_dbgfile == (FILE *)0x0) {
          local_58 = _stdout;
        }
        else {
          local_58 = (FILE *)h264_dbgfile;
        }
        fprintf(local_58,
                "nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag: %d \n",
                (ulong)(nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag & 1));
      }
    }
  }
  else {
    if (h264_dbgfile == (FILE *)0x0) {
      local_20 = _stdout;
    }
    else {
      local_20 = (FILE *)h264_dbgfile;
    }
    fprintf(local_20,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    nal->prefix_nal_svc->store_ref_base_pic_flag = uVar1 != 0;
    if (h264_dbgfile == (FILE *)0x0) {
      local_28 = _stdout;
    }
    else {
      local_28 = (FILE *)h264_dbgfile;
    }
    fprintf(local_28,"nal->prefix_nal_svc->store_ref_base_pic_flag: %d \n",
            (ulong)(nal->prefix_nal_svc->store_ref_base_pic_flag & 1));
    if ((((nal->nal_svc_ext->use_ref_base_pic_flag & 1U) != 0) ||
        ((nal->prefix_nal_svc->store_ref_base_pic_flag & 1U) != 0)) &&
       ((nal->nal_svc_ext->idr_flag & 1U) == 0)) {
      read_debug_dec_ref_base_pic_marking(nal,b);
    }
    if (h264_dbgfile == (FILE *)0x0) {
      local_30 = _stdout;
    }
    else {
      local_30 = (FILE *)h264_dbgfile;
    }
    fprintf(local_30,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag = uVar1 != 0;
    if (h264_dbgfile == (FILE *)0x0) {
      local_38 = _stdout;
    }
    else {
      local_38 = (FILE *)h264_dbgfile;
    }
    fprintf(local_38,"nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag: %d \n",
            (ulong)(nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag & 1));
    if ((nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag & 1U) != 0) {
      while (iVar2 = more_rbsp_data(b), iVar2 != 0) {
        if (h264_dbgfile == (FILE *)0x0) {
          local_40 = _stdout;
        }
        else {
          local_40 = (FILE *)h264_dbgfile;
        }
        fprintf(local_40,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        uVar1 = bs_read_u1(b);
        nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag = uVar1 != 0;
        if (h264_dbgfile == (FILE *)0x0) {
          local_48 = _stdout;
        }
        else {
          local_48 = (FILE *)h264_dbgfile;
        }
        fprintf(local_48,
                "nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag: %d \n",
                (ulong)(nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag & 1));
      }
    }
  }
  return;
}

Assistant:

void read_debug_prefix_nal_unit_svc(nal_t* nal, bs_t* b)
{
    if( nal->nal_ref_idc != 0 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); nal->prefix_nal_svc->store_ref_base_pic_flag = bs_read_u1(b); printf("nal->prefix_nal_svc->store_ref_base_pic_flag: %d \n", nal->prefix_nal_svc->store_ref_base_pic_flag); 
        if( ( nal->nal_svc_ext->use_ref_base_pic_flag || nal->prefix_nal_svc->store_ref_base_pic_flag ) &&
             !nal->nal_svc_ext->idr_flag )
        {
            read_debug_dec_ref_base_pic_marking( nal, b );
        }
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag = bs_read_u1(b); printf("nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag: %d \n", nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag); 
        if( nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag )
        {
            while( more_rbsp_data( b ) )
            {
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag = bs_read_u1(b); printf("nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag: %d \n", nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag); 
            }
        }
    }
    else if( more_rbsp_data( b ) )
    {
        while( more_rbsp_data( b ) )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag = bs_read_u1(b); printf("nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag: %d \n", nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag); 
        }
    }
}